

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O1

FilePathList LoadDirectoryFiles(char *dirPath)

{
  FilePathList FVar1;
  int iVar2;
  DIR *__dirp;
  dirent *pdVar3;
  char **ppcVar4;
  char *pcVar5;
  uint uVar6;
  ulong uVar7;
  FilePathList files;
  FilePathList local_48;
  
  local_48.capacity = 0;
  local_48.count = 0;
  local_48.paths = (char **)0x0;
  __dirp = opendir(dirPath);
  if (__dirp == (DIR *)0x0) {
    pcVar5 = "FILEIO: Failed to open requested directory";
  }
  else {
    pdVar3 = readdir(__dirp);
    if (pdVar3 == (dirent *)0x0) {
      uVar6 = 0;
    }
    else {
      uVar6 = 0;
      do {
        iVar2 = strcmp(pdVar3->d_name,".");
        if (iVar2 != 0) {
          iVar2 = strcmp(pdVar3->d_name,"..");
          uVar6 = (uVar6 + 1) - (uint)(iVar2 == 0);
        }
        pdVar3 = readdir(__dirp);
      } while (pdVar3 != (dirent *)0x0);
    }
    local_48.capacity = uVar6;
    ppcVar4 = (char **)malloc((ulong)uVar6 * 8);
    local_48.paths = ppcVar4;
    if (uVar6 != 0) {
      uVar7 = 0;
      do {
        pcVar5 = (char *)malloc(0x1000);
        ppcVar4[uVar7] = pcVar5;
        uVar7 = uVar7 + 1;
      } while (uVar6 != uVar7);
    }
    closedir(__dirp);
    ScanDirectoryFiles(dirPath,&local_48,(char *)0x0);
    if (local_48.count == local_48.capacity) goto LAB_00175c80;
    pcVar5 = "FILEIO: Read files count do not match capacity allocated";
  }
  TraceLog(4,pcVar5);
LAB_00175c80:
  FVar1.count = local_48.count;
  FVar1.capacity = local_48.capacity;
  FVar1.paths = local_48.paths;
  return FVar1;
}

Assistant:

FilePathList LoadDirectoryFiles(const char *dirPath)
{
    FilePathList files = { 0 };
    unsigned int fileCounter = 0;

    struct dirent *entity;
    DIR *dir = opendir(dirPath);

    if (dir != NULL) // It's a directory
    {
        // SCAN 1: Count files
        while ((entity = readdir(dir)) != NULL)
        {
            // NOTE: We skip '.' (current dir) and '..' (parent dir) filepaths
            if ((strcmp(entity->d_name, ".") != 0) && (strcmp(entity->d_name, "..") != 0)) fileCounter++;
        }

        // Memory allocation for dirFileCount
        files.capacity = fileCounter;
        files.paths = (char **)RL_MALLOC(files.capacity*sizeof(char *));
        for (unsigned int i = 0; i < files.capacity; i++) files.paths[i] = (char *)RL_MALLOC(MAX_FILEPATH_LENGTH*sizeof(char));

        closedir(dir);

        // SCAN 2: Read filepaths
        // NOTE: Directory paths are also registered
        ScanDirectoryFiles(dirPath, &files, NULL);

        // Security check: read files.count should match fileCounter
        if (files.count != files.capacity) TRACELOG(LOG_WARNING, "FILEIO: Read files count do not match capacity allocated");
    }
    else TRACELOG(LOG_WARNING, "FILEIO: Failed to open requested directory");  // Maybe it's a file...

    return files;
}